

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::fair::recursive_timed_mutex::
try_lock_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (recursive_timed_mutex *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  bool bVar1;
  pthread_t pVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> uStack_28;
  
  pVar2 = pthread_self();
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&(this->impl_).mtx_);
  if ((this->owner_)._M_thread == pVar2) {
    if (this->ncount_ == 0) {
      __assert_fail("0 < ncount_",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_mutex.hpp"
                    ,0x177,
                    "bool yamc::fair::recursive_timed_mutex::try_lock_until(const std::chrono::time_point<Clock, Duration> &) [Clock = std::chrono::system_clock, Duration = std::chrono::duration<long, std::ratio<1, 1000000000>>]"
                   );
    }
    this->ncount_ = this->ncount_ + 1;
  }
  else {
    bVar1 = detail::timed_mutex_impl::
            impl_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      (&this->impl_,&uStack_28,tp);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_00119247;
    }
    this->ncount_ = 1;
    (this->owner_)._M_thread = pVar2;
  }
  bVar1 = true;
LAB_00119247:
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return bVar1;
}

Assistant:

bool try_lock_until(const std::chrono::time_point<Clock, Duration>& tp)
  {
    const auto tid = std::this_thread::get_id();
    auto lk = impl_.internal_lock();
    if (owner_ == tid) {
      assert(0 < ncount_);
      ++ncount_;
      return true;
    }
    if (!impl_.impl_try_lockwait(lk, tp))
      return false;
    ncount_ = 1;
    owner_ = tid;
    return true;
  }